

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O1

ssize_t tnt_io_send(tnt_stream_net *s,char *buf,size_t size)

{
  size_t *psVar1;
  char *buf_00;
  ulong uVar2;
  size_t size_00;
  ssize_t sVar3;
  
  buf_00 = (s->sbuf).buf;
  if (buf_00 == (char *)0x0) {
    sVar3 = tnt_io_send_raw(s,buf,size,1);
    return sVar3;
  }
  uVar2 = (s->sbuf).size;
  if (uVar2 < size) {
    s->error = TNT_EBIG;
  }
  else {
    size_00 = (s->sbuf).off;
    if (size_00 + size <= uVar2) {
      memcpy(buf_00 + size_00,buf,size);
      psVar1 = &(s->sbuf).off;
      *psVar1 = *psVar1 + size;
      return size;
    }
    sVar3 = tnt_io_send_raw(s,buf_00,size_00,1);
    if (sVar3 != -1) {
      (s->sbuf).off = size;
      memcpy((s->sbuf).buf,buf,size);
      return size;
    }
  }
  return -1;
}

Assistant:

ssize_t
tnt_io_send(struct tnt_stream_net *s, const char *buf, size_t size)
{
	if (s->sbuf.buf == NULL)
		return tnt_io_send_raw(s, buf, size, 1);
	if (size > s->sbuf.size) {
		s->error = TNT_EBIG;
		return -1;
	}
	if ((s->sbuf.off + size) <= s->sbuf.size) {
		memcpy(s->sbuf.buf + s->sbuf.off, buf, size);
		s->sbuf.off += size;
		return size;
	}
	ssize_t r = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (r == -1)
		return -1;
	s->sbuf.off = size;
	memcpy(s->sbuf.buf, buf, size);
	return size;
}